

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingUtility.cpp
# Opt level: O2

vector<pica::Vector3<double>,_std::allocator<pica::Vector3<double>_>_> * __thiscall
BaseFixture::randomVectors
          (vector<pica::Vector3<double>,_std::allocator<pica::Vector3<double>_>_>
           *__return_storage_ptr__,BaseFixture *this,int n,FP3 *minValue,FP3 *maxValue)

{
  double *pdVar1;
  pointer pVVar2;
  ulong uVar3;
  BaseFixture *this_00;
  ulong uVar4;
  FP3 local_48;
  
  this_00 = (BaseFixture *)(long)n;
  std::vector<pica::Vector3<double>,_std::allocator<pica::Vector3<double>_>_>::vector
            (__return_storage_ptr__,(size_type)this_00,(allocator_type *)&local_48);
  uVar3 = 0;
  uVar4 = (ulong)(uint)n;
  if (n < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 * 0x18 - uVar3 != 0; uVar3 = uVar3 + 0x18) {
    urandFP3(&local_48,this_00,*minValue,*maxValue);
    pVVar2 = (__return_storage_ptr__->
             super__Vector_base<pica::Vector3<double>,_std::allocator<pica::Vector3<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *(double *)((long)&pVVar2->z + uVar3) = local_48.z;
    pdVar1 = (double *)((long)&pVVar2->x + uVar3);
    *pdVar1 = local_48.x;
    pdVar1[1] = local_48.y;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<FP3> BaseFixture::randomVectors(int n, FP3 & minValue, FP3 & maxValue) {
    std::vector<FP3> result(n);
    for (int i = 0; i < n; ++i)
        result[i] = urandFP3(minValue, maxValue);
    return result;
}